

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

string * __thiscall
directed_flag_complex_cell_t::to_string_abi_cxx11_
          (directed_flag_complex_cell_t *this,unsigned_short dim)

{
  ushort in_DX;
  undefined8 *in_RSI;
  string *in_RDI;
  unsigned_short index;
  directed_flag_complex_cell_t *t;
  string *s;
  string local_48 [36];
  uint3 in_stack_ffffffffffffffdc;
  uint uVar1;
  
  uVar1 = (uint)in_stack_ffffffffffffffdc;
  std::__cxx11::string::string((string *)in_RDI);
  for (uVar1 = uVar1 & 0xffff0000; (uVar1 & 0xffff) < in_DX + 1;
      uVar1 = CONCAT22((short)(uVar1 >> 0x10),(short)uVar1 + 1)) {
    (**(code **)*in_RSI)(in_RSI,(short)uVar1);
    std::__cxx11::to_string(uVar1);
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    if ((uVar1 & 0xffff) < (uint)in_DX) {
      std::__cxx11::string::operator+=((string *)in_RDI,"|");
    }
  }
  return in_RDI;
}

Assistant:

const std::string to_string(
#ifdef USE_CELLS_WITHOUT_DIMENSION
	    unsigned short dim
#endif
	) const {
		const directed_flag_complex_cell_t* t = this;
#ifndef USE_CELLS_WITHOUT_DIMENSION
		unsigned short dim = dimension();
#endif
		std::string s;
		for (unsigned short index = 0; index < dim + 1; index++) {
			s += std::to_string(t->vertex(index));
			if (index < dim) s += "|";
		}
		return s;
	}